

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

TRef lj_record_idx(jit_State *J,RecordIndex *ix)

{
  int *piVar1;
  uint16_t *ptr;
  long lVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  double dVar6;
  IRIns *pIVar7;
  TRef *pTVar8;
  TValue *pTVar9;
  TraceError e;
  IRRef1 IVar10;
  int iVar11;
  TRef TVar12;
  TRef TVar13;
  BCReg func;
  cTValue *pcVar14;
  cTValue *pcVar15;
  uint uVar16;
  long lVar17;
  uint8_t uVar18;
  bool bVar19;
  ushort uVar20;
  IRRef1 IVar21;
  uint uVar22;
  code *cont;
  ulong uVar23;
  uint uVar24;
  GCtab *pGVar25;
  ptrdiff_t pStack_70;
  
  pTVar9 = &ix->keyv;
  ptr = &J[-1].penalty[0x32].val;
  uVar22 = ix->tab;
LAB_00148f77:
  if ((uVar22 & 0x1f000000) != 0xb000000) {
    iVar11 = lj_record_mm_lookup(J,ix,(uint)(ix->val != 0));
    if (iVar11 == 0) {
      e = LJ_TRERR_NOMM;
      goto LAB_00149a40;
    }
    goto LAB_00149563;
  }
  dVar6 = pTVar9->n;
  if ((dVar6 == -NAN) || (((ushort)((ulong)dVar6 >> 0x30) < 0xfff9 && (NAN(dVar6))))) {
    if (ix->val != 0) {
      e = LJ_TRERR_STORENN;
      goto LAB_00149a40;
    }
    if ((ix->key & 0x8000) == 0) {
      if (ix->idxchain == 0) {
        return 0x7fff;
      }
      iVar11 = lj_record_mm_lookup(J,ix,MM_index);
      if (iVar11 == 0) {
        return 0x7fff;
      }
      goto LAB_00149563;
    }
  }
  pGVar25 = (GCtab *)((ix->tabv).u64 & 0x7fffffffffff);
  pcVar15 = lj_tab_get(J->L,pGVar25,pTVar9);
  ix->oldv = pcVar15;
  uVar22 = ix->key;
  if ((uVar22 >> 0x18 & 0x1e) - 0xe < 6) {
    dVar6 = pTVar9->n;
    uVar16 = (int)dVar6;
    if ((double)(int)dVar6 != dVar6) {
      uVar16 = 0x8000001;
    }
    if (NAN((double)(int)dVar6) || NAN(dVar6)) {
      uVar16 = 0x8000001;
    }
    if (0x8000000 < uVar16) {
      if ((short)uVar22 < 0) {
        if (pGVar25->asize == 0) {
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130008;
          TVar13 = lj_opt_fold(J);
          TVar12 = lj_ir_kint(J,0);
          (J->fold).ins.field_0.ot = 0x893;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
          lj_opt_fold(J);
          goto LAB_0014918b;
        }
        e = LJ_TRERR_NYITMIX;
        goto LAB_00149a40;
      }
      goto LAB_0014918b;
    }
    TVar13 = lj_opt_narrow_index(J,uVar22);
    (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130008;
    TVar12 = lj_opt_fold(J);
    if (pGVar25->asize <= uVar16) {
      (J->fold).ins.field_0.ot = 0x693;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar13;
      lj_opt_fold(J);
      if (uVar16 == 0 && (uVar22 & 0x8000) == 0) {
        uVar22 = lj_ir_knum_u64(J,0);
      }
      goto LAB_0014918b;
    }
    rec_idx_abc(J,TVar12,TVar13,pGVar25->asize);
    (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090006;
    TVar12 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x3809;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar13;
LAB_001492d1:
    TVar13 = lj_opt_fold(J);
LAB_0014933e:
    uVar16 = 0;
    uVar18 = '\0';
  }
  else {
LAB_0014918b:
    if (pGVar25->hmask == 0) {
      (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130009;
      TVar13 = lj_opt_fold(J);
      TVar12 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x893;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
      lj_opt_fold(J);
      TVar13 = lj_ir_kptr_(J,IR_KKPTR,ptr);
      goto LAB_0014933e;
    }
    if ((uVar22 >> 0x18 & 0x1f) - 0xf < 5) {
      (J->fold).ins.field_0.op1 = (IRRef1)uVar22;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
      uVar22 = lj_opt_fold(J);
    }
    if ((((short)(IRRef1)uVar22 < 0) ||
        (uVar23 = (long)ix->oldv - (pGVar25->node).ptr64, 0x17ffe8 < uVar23)) ||
       ((ulong)pGVar25->hmask * 0x18 < uVar23)) {
      TVar13 = ix->tab;
      (J->fold).ins.field_0.ot = 0x3a09;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar22;
      goto LAB_001492d1;
    }
    uVar16 = (J->cur).nins;
    uVar18 = (J->guardemit).irt;
    (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130009;
    TVar13 = lj_opt_fold(J);
    TVar12 = lj_ir_kint(J,pGVar25->hmask);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
    lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090007;
    TVar13 = lj_opt_fold(J);
    TVar12 = lj_ir_kslot(J,uVar22,(IRRef)((uVar23 & 0xffffffff) / 0x18));
    (J->fold).ins.field_0.ot = 0x3989;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
    TVar13 = lj_opt_fold(J);
  }
  IVar21 = (IRRef1)TVar13;
  pIVar7 = (J->cur).ir;
  uVar22 = TVar13 & 0xffff;
  cVar3 = *(char *)((long)pIVar7 + (ulong)uVar22 * 8 + 5);
  if (cVar3 == '\x1a') {
    pcVar15 = *(cTValue **)&pIVar7[(ulong)uVar22 + 1].i;
  }
  else {
    pcVar15 = ix->oldv;
  }
  uVar24 = cVar3 == '8' ^ 0x43;
  uVar4 = ix->val;
  if (uVar4 != 0) {
    pGVar25 = *(GCtab **)(((ix->tabv).u64 & 0x7fffffffffff) + 0x20);
    uVar5 = ix->key;
    if (uVar22 < uVar16) {
      lj_ir_rollback(J,uVar16);
      (J->guardemit).irt = uVar18;
    }
    if (pcVar15->u64 == 0xffffffffffffffff) {
      if (((ix->idxchain == 0) || (pGVar25 == (GCtab *)0x0)) ||
         ((pcVar14 = lj_tab_getstr(pGVar25,(GCstr *)J[-1].penalty[0x3e].pc.ptr64),
          pcVar14 == (cTValue *)0x0 || (pcVar14->u64 == 0xffffffffffffffff)))) {
        if (cVar3 == ':') {
          uVar20 = (ushort)(pcVar15 != (cTValue *)ptr) << 8 | 0x889;
          TVar13 = lj_ir_kptr_(J,IR_KKPTR,ptr);
          IVar10 = (IRRef1)TVar13;
          goto LAB_00149448;
        }
      }
      else {
        uVar20 = (ushort)(uVar24 << 8) | 0x80;
        IVar10 = 0;
LAB_00149448:
        (J->fold).ins.field_0.ot = uVar20;
        (J->fold).ins.field_0.op1 = IVar21;
        (J->fold).ins.field_0.op2 = IVar10;
        lj_opt_fold(J);
      }
      if ((ix->idxchain != 0) && (iVar11 = lj_record_mm_lookup(J,ix,MM_newindex), iVar11 != 0))
      goto LAB_00149563;
      if (pcVar15 == (cTValue *)ptr) {
        uVar22 = ix->key;
        IVar21 = (IRRef1)uVar22;
        if ((uVar22 >> 0x18 & 0x1f) - 0xf < 5) {
          (J->fold).ins.field_0.op1 = IVar21;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
          uVar22 = lj_opt_fold(J);
        }
        else if (((uVar22 & 0x1f000000) == 0xe000000) && ((short)IVar21 < 0)) {
          (J->fold).ins.field_0.ot = 0x88e;
          (J->fold).ins.field_0.op1 = IVar21;
          (J->fold).ins.field_0.op2 = IVar21;
          lj_opt_fold(J);
        }
        TVar13 = ix->tab;
        (J->fold).ins.field_0.ot = 0x3b09;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
        (J->fold).ins.field_0.op2 = (IRRef1)uVar22;
        TVar13 = lj_opt_fold(J);
        IVar21 = (IRRef1)TVar13;
        bVar19 = false;
      }
      else {
        bVar19 = (uVar4 & 0x1f000000) != 0 && (uVar5 >> 0x18 & 0x1f) - 4 < 9;
      }
    }
    else {
      iVar11 = lj_opt_fwd_wasnonnil(J,(IROpT)uVar24,uVar22);
      if (iVar11 == 0) {
        if (cVar3 == ':') {
          TVar13 = lj_ir_kptr_(J,IR_KKPTR,ptr);
          (J->fold).ins.field_0.ot = 0x989;
          (J->fold).ins.field_0.op1 = IVar21;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar13;
          lj_opt_fold(J);
        }
        bVar19 = (uVar4 & 0x1f000000) != 0 && (uVar5 >> 0x18 & 0x1f) - 4 < 9;
        if (ix->idxchain != 0) {
          if (pGVar25 == (GCtab *)0x0) {
            (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x450b0005;
            TVar13 = lj_opt_fold(J);
            TVar12 = lj_ir_knull(J,IRT_TAB);
            (J->fold).ins.field_0.ot = 0x88b;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
            lj_opt_fold(J);
          }
          else {
            uVar20 = 0x8e;
            if (0xfffffffffffffff1 < (ulong)(pcVar15->it64 >> 0x2f)) {
              uVar20 = ~(ushort)(int)(pcVar15->it64 >> 0x2f) | 0x80;
            }
            (J->fold).ins.field_0.ot = uVar20 + (short)(uVar24 << 8);
            (J->fold).ins.field_0.op1 = IVar21;
            (J->fold).ins.field_0.op2 = 0;
            lj_opt_fold(J);
          }
        }
      }
      else {
        bVar19 = false;
      }
    }
    uVar22 = ix->val;
    uVar16 = uVar22 >> 0x18 & 0x1f;
    if (uVar16 - 0xf < 5) {
      (J->fold).ins.field_0.op1 = (IRRef1)uVar22;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
      uVar22 = lj_opt_fold(J);
      ix->val = uVar22;
      uVar16 = uVar22 >> 0x18 & 0x1f;
    }
    (J->fold).ins.field_0.ot = (ushort)(uVar24 << 8) | (ushort)uVar16 | 0x800;
    (J->fold).ins.field_0.op1 = IVar21;
    (J->fold).ins.field_0.op2 = (IRRef1)uVar22;
    lj_opt_fold(J);
    if ((bVar19) || ((*(byte *)((long)&ix->val + 3) & 0x1f) - 4 < 9)) {
      (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x58000000;
      lj_opt_fold(J);
    }
    uVar22 = ix->key;
    if ((uVar22 & 0x1f000000) != 0x4000000) goto LAB_001499cb;
    if ((short)uVar22 < 0) goto LAB_00149982;
    lVar17 = 0;
    goto LAB_0014996b;
  }
  uVar22 = ~(uint)(pcVar15->it64 >> 0x2f);
  if ((ulong)(pcVar15->it64 >> 0x2f) < 0xfffffffffffffff2) {
    uVar22 = 0xe;
  }
  if (pcVar15 == (cTValue *)ptr) {
    TVar13 = lj_ir_kptr_(J,IR_KKPTR,ptr);
    (J->fold).ins.field_0.ot = 0x889;
    (J->fold).ins.field_0.op1 = IVar21;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar13;
    lj_opt_fold(J);
    TVar13 = 0x7fff;
  }
  else {
    (J->fold).ins.field_0.ot = (short)uVar22 + (short)(uVar24 << 8) + 0x80;
    (J->fold).ins.field_0.op1 = IVar21;
    (J->fold).ins.field_0.op2 = 0;
    TVar13 = lj_opt_fold(J);
  }
  if ((TVar13 & 0xffff) < uVar16) {
    lj_ir_rollback(J,uVar16);
    (J->guardemit).irt = uVar18;
  }
  if (uVar22 != 0) {
    if (uVar22 < 3) {
      return uVar22 * 0x1000001 ^ 0x7fff;
    }
    return TVar13;
  }
  if (ix->idxchain == 0) {
    return 0x7fff;
  }
  iVar11 = lj_record_mm_lookup(J,ix,MM_index);
  if (iVar11 == 0) {
    return 0x7fff;
  }
LAB_00149563:
  uVar22 = ix->mobj;
  if ((uVar22 & 0x1f000000) == 0x8000000) {
    cont = lj_cont_nop;
    if (ix->val == 0) {
      cont = lj_cont_ra;
    }
    func = rec_mm_prep(J,cont);
    pTVar8 = J->base;
    pTVar9 = J->L->base;
    pTVar8[func] = ix->mobj;
    pTVar8[(ulong)func + 2] = ix->tab;
    pTVar8[(ulong)func + 3] = ix->key;
    pTVar9[func].u64 = (ix->mobjv).u64 & 0x7fffffffffff | 0xfffb800000000000;
    pTVar9[(ulong)func + 2].gcr.gcptr64 = (uint64_t)ix->tabv;
    pTVar9[(ulong)func + 3] = ix->keyv;
    if (ix->val == 0) {
      pStack_70 = 2;
    }
    else {
      pTVar8[(ulong)func + 4] = ix->val;
      pTVar9[(ulong)func + 4] = ix->valv;
      pStack_70 = 3;
    }
    lj_record_call(J,func,pStack_70);
    return 0;
  }
  if (((((ix->mt == 0x7fff) && (ix->val == 0)) && ((ix->tab & 0x1f000000) == 0xc000000)) &&
      (((uVar22 & 0x1f000000) == 0xb000000 &&
       (*(char *)(((ix->tabv).u64 & 0x7fffffffffff) + 10) == '\x03')))) &&
     ((ix->key & 0x1f008000) == 0x4000000)) {
    pcVar15 = lj_tab_getstr((GCtab *)((ix->mobjv).u64 & 0x7fffffffffff),
                            (GCstr *)((ix->keyv).u64 & 0x7fffffffffff));
    TVar13 = lj_record_constify(J,pcVar15);
    if (TVar13 != 0) {
      return TVar13;
    }
    uVar22 = ix->mobj;
  }
  ix->tab = uVar22;
  ix->tabv = ix->mobjv;
  piVar1 = &ix->idxchain;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    e = LJ_TRERR_IDXLOOP;
LAB_00149a40:
    lj_trace_err(J,e);
  }
  goto LAB_00148f77;
  while (lVar2 = lVar17 * 8, lVar17 = lVar17 + 1,
        *(IRIns *)((long)J + lVar2 + -0x130) != (J->cur).ir[(ulong)(uVar22 & 0x7fff) + 1]) {
LAB_0014996b:
    if (lVar17 == 6) goto LAB_001499cb;
  }
LAB_00149982:
  (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e09000a;
  TVar13 = lj_opt_fold(J);
  TVar12 = lj_ir_kint(J,0);
  (J->fold).ins.field_0.ot = 0x4d10;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
  lj_opt_fold(J);
LAB_001499cb:
  J->needsnap = '\x01';
  return 0;
}

Assistant:

TRef lj_record_idx(jit_State *J, RecordIndex *ix)
{
  TRef xref;
  IROp xrefop, loadop;
  IRRef rbref;
  IRType1 rbguard;
  cTValue *oldv;

  while (!tref_istab(ix->tab)) { /* Handle non-table lookup. */
    /* Never call raw lj_record_idx() on non-table. */
    lj_assertJ(ix->idxchain != 0, "bad usage");
    if (!lj_record_mm_lookup(J, ix, ix->val ? MM_newindex : MM_index))
      lj_trace_err(J, LJ_TRERR_NOMM);
  handlemm:
    if (tref_isfunc(ix->mobj)) {  /* Handle metamethod call. */
      BCReg func = rec_mm_prep(J, ix->val ? lj_cont_nop : lj_cont_ra);
      TRef *base = J->base + func + LJ_FR2;
      TValue *tv = J->L->base + func + LJ_FR2;
      base[-LJ_FR2] = ix->mobj; base[1] = ix->tab; base[2] = ix->key;
      setfuncV(J->L, tv-LJ_FR2, funcV(&ix->mobjv));
      copyTV(J->L, tv+1, &ix->tabv);
      copyTV(J->L, tv+2, &ix->keyv);
      if (ix->val) {
	base[3] = ix->val;
	copyTV(J->L, tv+3, &ix->valv);
	lj_record_call(J, func, 3);  /* mobj(tab, key, val) */
	return 0;
      } else {
	lj_record_call(J, func, 2);  /* res = mobj(tab, key) */
	return 0;  /* No result yet. */
      }
    }
#if LJ_HASBUFFER
    /* The index table of buffer objects is treated as immutable. */
    if (ix->mt == TREF_NIL && !ix->val &&
	tref_isudata(ix->tab) && udataV(&ix->tabv)->udtype == UDTYPE_BUFFER &&
	tref_istab(ix->mobj) && tref_isstr(ix->key) && tref_isk(ix->key)) {
      cTValue *val = lj_tab_getstr(tabV(&ix->mobjv), strV(&ix->keyv));
      TRef tr = lj_record_constify(J, val);
      if (tr) return tr;  /* Specialize to the value, i.e. a method. */
    }
#endif
    /* Otherwise retry lookup with metaobject. */
    ix->tab = ix->mobj;
    copyTV(J->L, &ix->tabv, &ix->mobjv);
    if (--ix->idxchain == 0)
      lj_trace_err(J, LJ_TRERR_IDXLOOP);
  }

  /* First catch nil and NaN keys for tables. */
  if (tvisnil(&ix->keyv) || (tvisnum(&ix->keyv) && tvisnan(&ix->keyv))) {
    if (ix->val)  /* Better fail early. */
      lj_trace_err(J, LJ_TRERR_STORENN);
    if (tref_isk(ix->key)) {
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
	goto handlemm;
      return TREF_NIL;
    }
  }

  /* Record the key lookup. */
  xref = rec_idx_key(J, ix, &rbref, &rbguard);
  xrefop = IR(tref_ref(xref))->o;
  loadop = xrefop == IR_AREF ? IR_ALOAD : IR_HLOAD;
  /* The lj_meta_tset() inconsistency is gone, but better play safe. */
  oldv = xrefop == IR_KKPTR ? (cTValue *)ir_kptr(IR(tref_ref(xref))) : ix->oldv;

  if (ix->val == 0) {  /* Indexed load */
    IRType t = itype2irt(oldv);
    TRef res;
    if (oldv == niltvg(J2G(J))) {
      emitir(IRTG(IR_EQ, IRT_PGC), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      res = TREF_NIL;
    } else {
      res = emitir(IRTG(loadop, t), xref, 0);
    }
    if (tref_ref(res) < rbref) {  /* HREFK + load forwarded? */
      lj_ir_rollback(J, rbref);  /* Rollback to eliminate hmask guard. */
      J->guardemit = rbguard;
    }
    if (t == IRT_NIL && ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
      goto handlemm;
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitives. */
    return res;
  } else {  /* Indexed store. */
    GCtab *mt = tabref(tabV(&ix->tabv)->metatable);
    int keybarrier = tref_isgcv(ix->key) && !tref_isnil(ix->val);
    if (tref_ref(xref) < rbref) {  /* HREFK forwarded? */
      lj_ir_rollback(J, rbref);  /* Rollback to eliminate hmask guard. */
      J->guardemit = rbguard;
    }
    if (tvisnil(oldv)) {  /* Previous value was nil? */
      /* Need to duplicate the hasmm check for the early guards. */
      int hasmm = 0;
      if (ix->idxchain && mt) {
	cTValue *mo = lj_tab_getstr(mt, mmname_str(J2G(J), MM_newindex));
	hasmm = mo && !tvisnil(mo);
      }
      if (hasmm)
	emitir(IRTG(loadop, IRT_NIL), xref, 0);  /* Guard for nil value. */
      else if (xrefop == IR_HREF)
	emitir(IRTG(oldv == niltvg(J2G(J)) ? IR_EQ : IR_NE, IRT_PGC),
	       xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_newindex)) {
	lj_assertJ(hasmm, "inconsistent metamethod handling");
	goto handlemm;
      }
      lj_assertJ(!hasmm, "inconsistent metamethod handling");
      if (oldv == niltvg(J2G(J))) {  /* Need to insert a new key. */
	TRef key = ix->key;
	if (tref_isinteger(key)) {  /* NEWREF needs a TValue as a key. */
	  key = emitir(IRTN(IR_CONV), key, IRCONV_NUM_INT);
	} else if (tref_isnum(key)) {
	  if (tref_isk(key)) {
	    if (tvismzero(&ix->keyv))
	      key = lj_ir_knum_zero(J);  /* Canonicalize -0.0 to +0.0. */
	  } else {
	    emitir(IRTG(IR_EQ, IRT_NUM), key, key);  /* Check for !NaN. */
	  }
	}
	xref = emitir(IRT(IR_NEWREF, IRT_PGC), ix->tab, key);
	keybarrier = 0;  /* NEWREF already takes care of the key barrier. */
#ifdef LUAJIT_ENABLE_TABLE_BUMP
	if ((J->flags & JIT_F_OPT_SINK))  /* Avoid a separate flag. */
	  rec_idx_bump(J, ix);
#endif
      }
    } else if (!lj_opt_fwd_wasnonnil(J, loadop, tref_ref(xref))) {
      /* Cannot derive that the previous value was non-nil, must do checks. */
      if (xrefop == IR_HREF)  /* Guard against store to niltv. */
	emitir(IRTG(IR_NE, IRT_PGC), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain) {  /* Metamethod lookup required? */
	/* A check for NULL metatable is cheaper (hoistable) than a load. */
	if (!mt) {
	  TRef mtref = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
	  emitir(IRTG(IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
	} else {
	  IRType t = itype2irt(oldv);
	  emitir(IRTG(loadop, t), xref, 0);  /* Guard for non-nil value. */
	}
      }
    } else {
      keybarrier = 0;  /* Previous non-nil value kept the key alive. */
    }
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(ix->val))
      ix->val = emitir(IRTN(IR_CONV), ix->val, IRCONV_NUM_INT);
    emitir(IRT(loadop+IRDELTA_L2S, tref_type(ix->val)), xref, ix->val);
    if (keybarrier || tref_isgcv(ix->val))
      emitir(IRT(IR_TBAR, IRT_NIL), ix->tab, 0);
    /* Invalidate neg. metamethod cache for stores with certain string keys. */
    if (!nommstr(J, ix->key)) {
      TRef fref = emitir(IRT(IR_FREF, IRT_PGC), ix->tab, IRFL_TAB_NOMM);
      emitir(IRT(IR_FSTORE, IRT_U8), fref, lj_ir_kint(J, 0));
    }
    J->needsnap = 1;
    return 0;
  }
}